

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

Pixel * __thiscall olc::Pixel::operator/=(Pixel *this,float i)

{
  float *pfVar1;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  Pixel *pPStack_10;
  float i_local;
  Pixel *this_local;
  
  local_18 = 255.0;
  local_1c = 0.0;
  local_20 = (float)(this->field_0).field_1.r / i;
  local_14 = i;
  pPStack_10 = this;
  pfVar1 = std::max<float>(&local_1c,&local_20);
  pfVar1 = std::min<float>(&local_18,pfVar1);
  (this->field_0).field_1.r = (uint8_t)(int)*pfVar1;
  local_24 = 255.0;
  local_28 = 0.0;
  local_2c = (float)(this->field_0).field_1.g / local_14;
  pfVar1 = std::max<float>(&local_28,&local_2c);
  pfVar1 = std::min<float>(&local_24,pfVar1);
  (this->field_0).field_1.g = (uint8_t)(int)*pfVar1;
  local_30 = 255.0;
  local_34 = 0.0;
  local_38 = (float)(this->field_0).field_1.b / local_14;
  pfVar1 = std::max<float>(&local_34,&local_38);
  pfVar1 = std::min<float>(&local_30,pfVar1);
  (this->field_0).field_1.b = (uint8_t)(int)*pfVar1;
  return this;
}

Assistant:

Pixel& Pixel::operator /=(const float i)
	{
		this->r = uint8_t(std::min(255.0f, std::max(0.0f, float(r) / i)));
		this->g = uint8_t(std::min(255.0f, std::max(0.0f, float(g) / i)));
		this->b = uint8_t(std::min(255.0f, std::max(0.0f, float(b) / i)));
		return *this;
	}